

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_nonce_gen_counter
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uint64_t nonrepeating_cnt,
              secp256k1_keypair *keypair,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  int iVar1;
  uint64_t in_RCX;
  void *in_RSI;
  long in_RDI;
  long in_R8;
  int ret;
  secp256k1_pubkey pubkey;
  uchar seckey [32];
  uchar buf [32];
  secp256k1_pubkey *in_stack_00000380;
  uchar *in_stack_00000388;
  uchar *in_stack_00000390;
  secp256k1_musig_pubnonce *in_stack_00000398;
  secp256k1_musig_secnonce *in_stack_000003a0;
  secp256k1_context *in_stack_000003a8;
  uchar *in_stack_000003c0;
  secp256k1_musig_keyagg_cache *in_stack_000003c8;
  uchar *in_stack_000003d0;
  secp256k1_keypair *in_stack_ffffffffffffff28;
  secp256k1_callback *in_stack_ffffffffffffff30;
  secp256k1_context *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  uchar local_58 [40];
  long local_30;
  uint64_t local_28;
  void *local_18;
  long local_10;
  int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_58,0,0x20);
  if (local_10 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
            ,0x1f7,"test condition failed: ctx != NULL");
    abort();
  }
  if (local_18 == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    local_4 = 0;
  }
  else {
    memset(local_18,0,0x84);
    if (local_30 == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      local_4 = 0;
    }
    else {
      secp256k1_write_be64(local_58,local_28);
      iVar1 = secp256k1_keypair_sec
                        (in_stack_ffffffffffffff38,(uchar *)in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
                ,0x1ff,"test condition failed: ret");
        abort();
      }
      iVar1 = secp256k1_keypair_pub
                        (in_stack_ffffffffffffff38,(secp256k1_pubkey *)in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/session_impl.h"
                ,0x201,"test condition failed: ret");
        abort();
      }
      iVar1 = secp256k1_musig_nonce_gen_internal
                        (in_stack_000003a8,in_stack_000003a0,in_stack_00000398,in_stack_00000390,
                         in_stack_00000388,in_stack_00000380,in_stack_000003c0,in_stack_000003c8,
                         in_stack_000003d0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_memclear(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_nonce_gen_counter(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, uint64_t nonrepeating_cnt, const secp256k1_keypair *keypair, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    unsigned char buf[32] = { 0 };
    unsigned char seckey[32];
    secp256k1_pubkey pubkey;
    int ret;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secnonce != NULL);
    memset(secnonce, 0, sizeof(*secnonce));
    ARG_CHECK(keypair != NULL);

    secp256k1_write_be64(buf, nonrepeating_cnt);
    /* keypair_sec and keypair_pub do not fail if the arguments are not NULL */
    ret = secp256k1_keypair_sec(ctx, seckey, keypair);
    VERIFY_CHECK(ret);
    ret = secp256k1_keypair_pub(ctx, &pubkey, keypair);
    VERIFY_CHECK(ret);
#ifndef VERIFY
    (void) ret;
#endif

    if (!secp256k1_musig_nonce_gen_internal(ctx, secnonce, pubnonce, buf, seckey, &pubkey, msg32, keyagg_cache, extra_input32)) {
        return 0;
    }
    secp256k1_memclear(seckey, sizeof(seckey));
    return 1;
}